

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O1

char * form_bit_name(long *form_flags)

{
  char *pcVar1;
  size_t sVar2;
  undefined8 uVar3;
  
  form_bit_name::buf[0] = '\0';
  if ((*form_flags & 2U) == 0) {
    if ((*form_flags & 1U) == 0) goto LAB_002a7e53;
    uVar3 = 0x656c6269646520;
  }
  else {
    uVar3 = 0x6e6f73696f7020;
  }
  sVar2 = strlen(form_bit_name::buf);
  *(undefined8 *)(form_bit_name::buf + sVar2) = uVar3;
LAB_002a7e53:
  if ((*form_flags & 4) != 0) {
    sVar2 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar2," magical",8);
    form_bit_name::buf[sVar2 + 8] = '\0';
  }
  if ((*form_flags & 8) != 0) {
    sVar2 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar2," instant",8);
    builtin_strncpy(form_bit_name::buf + sVar2 + 5,"ant_rot",8);
  }
  if ((*form_flags & 0x10) != 0) {
    sVar2 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar2," oth",4);
    builtin_strncpy(form_bit_name::buf + sVar2 + 3,"her",4);
  }
  if ((*form_flags & 0x40) != 0) {
    sVar2 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar2," animal",8);
  }
  if ((*form_flags & 0x80) != 0) {
    sVar2 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar2," sentien",8);
    (form_bit_name::buf + sVar2 + 8)[0] = 't';
    (form_bit_name::buf + sVar2 + 8)[1] = '\0';
  }
  if ((*form_flags & 0x100) != 0) {
    sVar2 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar2," undead",8);
  }
  if ((*form_flags & 0x200) != 0) {
    sVar2 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar2," constru",8);
    builtin_strncpy(form_bit_name::buf + sVar2 + 7,"uct",4);
  }
  if ((*form_flags & 0x400) != 0) {
    sVar2 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar2," mis",4);
    (form_bit_name::buf + sVar2 + 4)[0] = 't';
    (form_bit_name::buf + sVar2 + 4)[1] = '\0';
  }
  if ((*form_flags & 0x800) != 0) {
    sVar2 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar2," intangi",8);
    builtin_strncpy(form_bit_name::buf + sVar2 + 8,"ble",4);
  }
  if ((*form_flags & 0x1000) != 0) {
    sVar2 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar2," bip",4);
    builtin_strncpy(form_bit_name::buf + sVar2 + 3,"ped",4);
  }
  if ((*form_flags & 0x2000) != 0) {
    sVar2 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar2," aquatic",8);
    form_bit_name::buf[sVar2 + 8] = '\0';
  }
  if ((*form_flags & 0x4000) != 0) {
    sVar2 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar2," insect",8);
  }
  if ((*form_flags & 0x8000) != 0) {
    sVar2 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar2," spider",8);
  }
  if ((*form_flags & 0x10000) != 0) {
    sVar2 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar2," crustac",8);
    builtin_strncpy(form_bit_name::buf + sVar2 + 8,"ean",4);
  }
  if ((*form_flags & 0x20000) != 0) {
    sVar2 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar2," wor",4);
    (form_bit_name::buf + sVar2 + 4)[0] = 'm';
    (form_bit_name::buf + sVar2 + 4)[1] = '\0';
  }
  if ((*form_flags & 0x40000) != 0) {
    sVar2 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar2," blo",4);
    (form_bit_name::buf + sVar2 + 4)[0] = 'b';
    (form_bit_name::buf + sVar2 + 4)[1] = '\0';
  }
  if ((*form_flags & 0x200000) != 0) {
    sVar2 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar2," mammal",8);
  }
  if ((*form_flags & 0x400000) != 0) {
    sVar2 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar2," bir",4);
    (form_bit_name::buf + sVar2 + 4)[0] = 'd';
    (form_bit_name::buf + sVar2 + 4)[1] = '\0';
  }
  if ((*form_flags & 0x800000) != 0) {
    sVar2 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar2," reptile",8);
    form_bit_name::buf[sVar2 + 8] = '\0';
  }
  if ((*form_flags & 0x1000000) != 0) {
    sVar2 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar2," sna",4);
    builtin_strncpy(form_bit_name::buf + sVar2 + 3,"ake",4);
  }
  if ((*form_flags & 0x2000000) != 0) {
    sVar2 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar2," dragon",8);
  }
  if ((*form_flags & 0x4000000) != 0) {
    sVar2 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar2," amphibi",8);
    builtin_strncpy(form_bit_name::buf + sVar2 + 7,"ian",4);
  }
  if ((*form_flags & 0x8000000) != 0) {
    sVar2 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar2," fis",4);
    (form_bit_name::buf + sVar2 + 4)[0] = 'h';
    (form_bit_name::buf + sVar2 + 4)[1] = '\0';
  }
  if ((*form_flags & 0x10000000) != 0) {
    sVar2 = strlen(form_bit_name::buf);
    builtin_strncpy(form_bit_name::buf + sVar2," cold_bl",8);
    builtin_strncpy(form_bit_name::buf + sVar2 + 6,"blooded",8);
  }
  pcVar1 = form_bit_name::buf;
  if (form_bit_name::buf[0] == '\0') {
    pcVar1 = " none";
  }
  return pcVar1 + 1;
}

Assistant:

char *form_bit_name(long form_flags[])
{
	static char buf[512];

	buf[0] = '\0';

	if (IS_SET(form_flags, FORM_POISON))
		strcat(buf, " poison");
	else if (IS_SET(form_flags, FORM_EDIBLE))
		strcat(buf, " edible");

	if (IS_SET(form_flags, FORM_MAGICAL))
		strcat(buf, " magical");

	if (IS_SET(form_flags, FORM_INSTANT_DECAY))
		strcat(buf, " instant_rot");

	if (IS_SET(form_flags, FORM_OTHER))
		strcat(buf, " other");

	if (IS_SET(form_flags, FORM_ANIMAL))
		strcat(buf, " animal");

	if (IS_SET(form_flags, FORM_SENTIENT))
		strcat(buf, " sentient");

	if (IS_SET(form_flags, FORM_UNDEAD))
		strcat(buf, " undead");

	if (IS_SET(form_flags, FORM_CONSTRUCT))
		strcat(buf, " construct");

	if (IS_SET(form_flags, FORM_MIST))
		strcat(buf, " mist");

	if (IS_SET(form_flags, FORM_INTANGIBLE))
		strcat(buf, " intangible");

	if (IS_SET(form_flags, FORM_BIPED))
		strcat(buf, " biped");

	if (IS_SET(form_flags, FORM_AQUATIC))
		strcat(buf, " aquatic");

	if (IS_SET(form_flags, FORM_INSECT))
		strcat(buf, " insect");

	if (IS_SET(form_flags, FORM_SPIDER))
		strcat(buf, " spider");

	if (IS_SET(form_flags, FORM_CRUSTACEAN))
		strcat(buf, " crustacean");

	if (IS_SET(form_flags, FORM_WORM))
		strcat(buf, " worm");

	if (IS_SET(form_flags, FORM_BLOB))
		strcat(buf, " blob");

	if (IS_SET(form_flags, FORM_MAMMAL))
		strcat(buf, " mammal");

	if (IS_SET(form_flags, FORM_BIRD))
		strcat(buf, " bird");

	if (IS_SET(form_flags, FORM_REPTILE))
		strcat(buf, " reptile");

	if (IS_SET(form_flags, FORM_SNAKE))
		strcat(buf, " snake");

	if (IS_SET(form_flags, FORM_DRAGON))
		strcat(buf, " dragon");

	if (IS_SET(form_flags, FORM_AMPHIBIAN))
		strcat(buf, " amphibian");

	if (IS_SET(form_flags, FORM_FISH))
		strcat(buf, " fish");

	if (IS_SET(form_flags, FORM_COLD_BLOOD))
		strcat(buf, " cold_blooded");

	return (buf[0] != '\0') ? buf + 1 : (char *)"none";
}